

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseIdentifierOrFunctionInvocationExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  allocator<char> local_31;
  
  TokenBuffer::currentToken((TokenBuffer *)local_60);
  iVar1 = *(int *)&(((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                      *)(local_60._0_8_ + 0x18))->
                   super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  if (iVar1 == 0x18) {
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    do {
      TokenBuffer::tokenAt
                ((TokenBuffer *)local_60,
                 (size_t)(this->tokenBuffer).
                         super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar1 = *(int *)&(((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                          *)(local_60._0_8_ + 0x18))->
                       super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    } while (iVar1 == 4);
    TokenBuffer::tokenAt
              ((TokenBuffer *)local_60,
               (size_t)(this->tokenBuffer).
                       super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = *(int *)&(((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                        *)(local_60._0_8_ + 0x18))->
                     super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    if (iVar1 == 5) {
      parseFunctionInvocationExpression
                ((optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *)local_60,this);
      __return_storage_ptr__ = (optional<std::shared_ptr<ExpressionAstNode>_> *)local_40._M_pi;
      std::optional<std::shared_ptr<ExpressionAstNode>_>::
      optional<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true>
                ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_40._M_pi,
                 (optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *)local_60);
      std::_Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *)
                 local_60);
    }
    else {
      parseIdentiferExpression
                ((optional<std::shared_ptr<IdentifierExpressionAstNode>_> *)local_60,this);
      __return_storage_ptr__ = (optional<std::shared_ptr<ExpressionAstNode>_> *)local_40._M_pi;
      std::optional<std::shared_ptr<ExpressionAstNode>_>::
      optional<std::shared_ptr<IdentifierExpressionAstNode>,_true>
                ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_40._M_pi,
                 (optional<std::shared_ptr<IdentifierExpressionAstNode>_> *)local_60);
      std::_Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_> *)local_60);
    }
  }
  else {
    TokenBuffer::currentToken((TokenBuffer *)local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"Expected an identifier.",&local_31);
    reportError(this,(shared_ptr<Token> *)local_70,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>)
    ._M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  }
  return (optional<std::shared_ptr<ExpressionAstNode>_> *)
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseIdentifierOrFunctionInvocationExpression() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    this->reportError(this->tokenBuffer->currentToken(), "Expected an identifier.");
    return std::nullopt;
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::LeftParen) {
    return this->parseFunctionInvocationExpression();
  }

  return this->parseIdentiferExpression();
}